

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::MergePartialFromImpl<true>
          (internal *this,BoundedZCIS input,MessageLite *msg)

{
  bool bVar1;
  char *ptr;
  BoundedZCIS input_local;
  ParseContext ctx;
  
  input_local.limit = (int)input.zcis;
  input_local.zcis = (ZeroCopyInputStream *)this;
  ParseContext::ParseContext<google::protobuf::io::ZeroCopyInputStream*&,int&>
            (&ctx,io::CodedInputStream::default_recursion_limit_,true,&ptr,&input_local.zcis,
             &input_local.limit);
  ptr = (char *)(**(code **)(*input._8_8_ + 0x68))(input._8_8_,ptr,&ctx);
  if (ptr == (char *)0x0) {
    bVar1 = false;
  }
  else {
    EpsCopyInputStream::BackUp(&ctx.super_EpsCopyInputStream,ptr);
    bVar1 = ctx.super_EpsCopyInputStream.last_tag_minus_1_ == 0;
  }
  return bVar1;
}

Assistant:

bool MergePartialFromImpl(BoundedZCIS input, MessageLite* msg) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input.zcis, input.limit);
  ptr = msg->_InternalParse(ptr, &ctx);
  if (PROTOBUF_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  return ctx.EndedAtLimit();
}